

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int str_find_aux(lua_State *L,int find)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  lua_Integer pos;
  ptrdiff_t pVar4;
  char *pcVar5;
  lua_State *L_00;
  int in_ESI;
  long in_RDI;
  char *res;
  char *s1;
  int anchor;
  MatchState ms;
  char *s2;
  ptrdiff_t init;
  char *p;
  char *s;
  size_t l2;
  size_t l1;
  uint in_stack_fffffffffffffd78;
  uint uVar6;
  int in_stack_fffffffffffffd7c;
  uint uVar7;
  lua_State *in_stack_fffffffffffffd80;
  size_t *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  uint uVar8;
  lua_State *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  MatchState *in_stack_fffffffffffffdd0;
  ulong local_40;
  size_t local_20;
  
  pcVar2 = luaL_checklstring(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                             in_stack_fffffffffffffd88);
  pcVar3 = luaL_checklstring(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                             in_stack_fffffffffffffd88);
  pos = luaL_optinteger(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                        (lua_Integer)in_stack_fffffffffffffd88);
  pVar4 = posrelat(pos,local_20);
  local_40 = pVar4 - 1;
  if ((long)local_40 < 0) {
    local_40 = 0;
  }
  else if (local_20 < local_40) {
    *(undefined4 *)(*(long *)(in_RDI + 0x18) + -4) = 0xffffffff;
    return 1;
  }
  if ((in_ESI == 0) ||
     ((iVar1 = lua_toboolean(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c), iVar1 == 0 &&
      (pcVar5 = strpbrk(pcVar3,"^$*+?.([%-"), pcVar5 != (char *)0x0)))) {
    uVar7 = (uint)(*pcVar3 == '^');
    pcVar3 = pcVar2 + local_40;
    uVar8 = uVar7;
    do {
      L_00 = (lua_State *)
             match(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (L_00 != (lua_State *)0x0) {
        if (in_ESI != 0) {
          lua_pushinteger(L_00,CONCAT44(uVar7,in_stack_fffffffffffffd78));
          lua_pushinteger(L_00,CONCAT44(uVar7,in_stack_fffffffffffffd78));
          iVar1 = push_captures((MatchState *)CONCAT44(uVar8,in_stack_fffffffffffffd90),pcVar3,
                                (char *)L_00);
          return iVar1 + 2;
        }
        iVar1 = push_captures((MatchState *)CONCAT44(uVar8,in_stack_fffffffffffffd90),pcVar3,
                              (char *)L_00);
        return iVar1;
      }
      uVar6 = in_stack_fffffffffffffd78 & 0xffffff;
      if (pcVar3 < pcVar2 + local_20) {
        uVar6 = CONCAT13(uVar8 != 0,(int3)in_stack_fffffffffffffd78) ^ 0xff000000;
      }
      in_stack_fffffffffffffd78 = uVar6;
      pcVar3 = pcVar3 + 1;
    } while ((uVar6 & 0x1000000) != 0);
    in_stack_fffffffffffffd80 = (lua_State *)0x0;
  }
  else {
    pcVar2 = lmemfind((char *)in_stack_fffffffffffffd98,
                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                      (char *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    if (pcVar2 != (char *)0x0) {
      lua_pushinteger(in_stack_fffffffffffffd80,
                      CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      lua_pushinteger(in_stack_fffffffffffffd80,
                      CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      return 2;
    }
  }
  lua_pushnil(in_stack_fffffffffffffd80);
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) {
    init = 0;
  } else if ((size_t)(init) > l1) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    init = (ptrdiff_t)l1;
#endif
  }
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-(size_t)init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+(ptrdiff_t)l2);
      return 2;
    }
  } else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = ms.depth = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
	if (find) {
	  lua_pushinteger(L, s1-s+1);  /* start */
	  lua_pushinteger(L, res-s);   /* end */
	  return push_captures(&ms, NULL, 0) + 2;
	} else {
	  return push_captures(&ms, s1, res);
	}
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}